

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

string * __thiscall
flatbuffers::dart::DartGenerator::GenObjectBuilderImplementation_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields,bool prependUnderscore,bool pack)

{
  FieldDef *s;
  bool bVar1;
  pointer ppVar2;
  char *pcVar3;
  byte local_5f9;
  string local_5c0;
  string local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  Type local_480;
  string local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  Type local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined4 local_25c;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  Type local_f8;
  string local_d8;
  undefined1 local_b8 [8];
  string field_name;
  undefined1 local_78 [8];
  string offset_name;
  FieldDef *field;
  __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
  local_38;
  const_iterator it;
  bool pack_local;
  bool prependUnderscore_local;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *non_deprecated_fields_local;
  StructDef *struct_def_local;
  DartGenerator *this_local;
  string *code;
  
  it._M_current._5_1_ = 0;
  it._M_current._6_1_ = pack;
  it._M_current._7_1_ = prependUnderscore;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_38._M_current =
       (pair<int,_flatbuffers::FieldDef_*> *)
       std::
       vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
       ::begin(non_deprecated_fields);
  while( true ) {
    field = (FieldDef *)
            std::
            vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
            ::end(non_deprecated_fields);
    bVar1 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
                        *)&field);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
             ::operator->(&local_38);
    s = ppVar2->second;
    bVar1 = IsScalar((s->value).type.base_type);
    if ((!bVar1) && (bVar1 = IsStruct(&(s->value).type), !bVar1)) {
      IdlNamer::Variable_abi_cxx11_((string *)((long)&field_name.field_2 + 8),&this->namer_,s);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_name.field_2 + 8),"Offset");
      std::__cxx11::string::~string((string *)(field_name.field_2._M_local_buf + 8));
      pcVar3 = "";
      if ((it._M_current._7_1_ & 1) != 0) {
        pcVar3 = "_";
      }
      IdlNamer::Variable_abi_cxx11_(&local_d8,&this->namer_,s);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     pcVar3,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      local_5f9 = 0;
      if ((it._M_current._6_1_ & 1) != 0) {
        bVar1 = IsVector(&(s->value).type);
        local_5f9 = 0;
        if (bVar1) {
          Type::VectorType(&local_f8,&(s->value).type);
          local_5f9 = 0;
          if (local_f8.base_type == BASE_TYPE_STRUCT) {
            local_5f9 = ((s->value).type.struct_def)->fixed;
          }
        }
      }
      if ((local_5f9 & 1) == 0) {
        std::operator+(&local_280,"    final int? ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                      );
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_280);
        std::__cxx11::string::~string((string *)&local_280);
        bVar1 = IsVector(&(s->value).type);
        if (bVar1) {
          std::operator+(&local_2c0," = ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8);
          std::operator+(&local_2a0,&local_2c0," == null ? null\n");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_2c0);
          std::__cxx11::string::operator+=
                    ((string *)__return_storage_ptr__,"        : fbBuilder.writeList");
          Type::VectorType(&local_2e0,&(s->value).type);
          if (local_2e0.base_type == BASE_TYPE_STRING) {
            std::operator+(&local_320,"(",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b8);
            std::operator+(&local_300,&local_320,"!.map(fbBuilder.writeString).toList());\n");
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_300);
            std::__cxx11::string::~string((string *)&local_300);
            std::__cxx11::string::~string((string *)&local_320);
          }
          else if (local_2e0.base_type == BASE_TYPE_STRUCT) {
            if ((((s->value).type.struct_def)->fixed & 1U) == 0) {
              std::operator+(&local_3e0,"(",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_b8);
              std::operator+(&local_3c0,&local_3e0,"!.map((b) => b.");
              pcVar3 = "getOrCreateOffset";
              if ((it._M_current._6_1_ & 1) != 0) {
                pcVar3 = "pack";
              }
              std::operator+(&local_3a0,&local_3c0,pcVar3);
              std::operator+(&local_380,&local_3a0,"(fbBuilder)).toList());\n");
              std::__cxx11::string::operator+=
                        ((string *)__return_storage_ptr__,(string *)&local_380);
              std::__cxx11::string::~string((string *)&local_380);
              std::__cxx11::string::~string((string *)&local_3a0);
              std::__cxx11::string::~string((string *)&local_3c0);
              std::__cxx11::string::~string((string *)&local_3e0);
            }
            else {
              std::operator+(&local_360,"OfStructs(",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_b8);
              std::operator+(&local_340,&local_360,"!);\n");
              std::__cxx11::string::operator+=
                        ((string *)__return_storage_ptr__,(string *)&local_340);
              std::__cxx11::string::~string((string *)&local_340);
              std::__cxx11::string::~string((string *)&local_360);
            }
          }
          else {
            Type::VectorType(&local_480,&(s->value).type);
            GenType_abi_cxx11_(&local_460,this,&local_480);
            std::operator+(&local_440,&local_460,"(");
            std::operator+(&local_420,&local_440,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b8);
            std::operator+(&local_400,&local_420,"!");
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_400);
            std::__cxx11::string::~string((string *)&local_400);
            std::__cxx11::string::~string((string *)&local_420);
            std::__cxx11::string::~string((string *)&local_440);
            std::__cxx11::string::~string((string *)&local_460);
            if ((s->value).type.enum_def != (EnumDef *)0x0) {
              std::__cxx11::string::operator+=
                        ((string *)__return_storage_ptr__,".map((f) => f.value).toList()");
            }
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,");\n");
          }
        }
        else {
          bVar1 = IsString(&(s->value).type);
          if (bVar1) {
            std::operator+(&local_4c0," = ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b8);
            std::operator+(&local_4a0,&local_4c0," == null ? null\n");
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_4a0);
            std::__cxx11::string::~string((string *)&local_4a0);
            std::__cxx11::string::~string((string *)&local_4c0);
            std::operator+(&local_500,"        : fbBuilder.writeString(",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b8);
            std::operator+(&local_4e0,&local_500,"!);\n");
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_4e0);
            std::__cxx11::string::~string((string *)&local_4e0);
            std::__cxx11::string::~string((string *)&local_500);
          }
          else {
            std::operator+(&local_580," = ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b8);
            std::operator+(&local_560,&local_580,"?.");
            pcVar3 = "getOrCreateOffset";
            if ((it._M_current._6_1_ & 1) != 0) {
              pcVar3 = "pack";
            }
            std::operator+(&local_540,&local_560,pcVar3);
            std::operator+(&local_520,&local_540,"(fbBuilder);\n");
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_520);
            std::__cxx11::string::~string((string *)&local_520);
            std::__cxx11::string::~string((string *)&local_540);
            std::__cxx11::string::~string((string *)&local_560);
            std::__cxx11::string::~string((string *)&local_580);
          }
        }
        local_25c = 0;
      }
      else {
        std::operator+(&local_138,"    int? ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                      );
        std::operator+(&local_118,&local_138,";\n");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_138);
        std::operator+(&local_178,"    if (",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                      );
        std::operator+(&local_158,&local_178," != null) {\n");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        std::operator+(&local_1b8,"      for (var e in ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                      );
        std::operator+(&local_198,&local_1b8,"!) { e.pack(fbBuilder); }\n");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_198);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
        IdlNamer::Variable_abi_cxx11_(&local_258,&this->namer_,s);
        std::operator+(&local_238,"      ",&local_258);
        std::operator+(&local_218,&local_238,"Offset = fbBuilder.endStructVector(");
        std::operator+(&local_1f8,&local_218,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                      );
        std::operator+(&local_1d8,&local_1f8,"!.length);\n");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"    }\n");
        local_25c = 4;
      }
      std::__cxx11::string::~string((string *)local_b8);
      std::__cxx11::string::~string((string *)local_78);
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
    ::operator++(&local_38);
  }
  if ((struct_def->fixed & 1U) == 0) {
    TableObjectBuilderBody_abi_cxx11_
              (&local_5c0,this,struct_def,non_deprecated_fields,(bool)(it._M_current._7_1_ & 1),
               (bool)(it._M_current._6_1_ & 1));
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_5c0);
    std::__cxx11::string::~string((string *)&local_5c0);
  }
  else {
    StructObjectBuilderBody_abi_cxx11_
              (&local_5a0,this,non_deprecated_fields,(bool)(it._M_current._7_1_ & 1),
               (bool)(it._M_current._6_1_ & 1));
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_5a0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenObjectBuilderImplementation(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields,
      bool prependUnderscore = true, bool pack = false) {
    std::string code;
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;

      if (IsScalar(field.value.type.base_type) || IsStruct(field.value.type))
        continue;

      std::string offset_name = namer_.Variable(field) + "Offset";
      std::string field_name =
          (prependUnderscore ? "_" : "") + namer_.Variable(field);
      // custom handling for fixed-sized struct in pack()
      if (pack && IsVector(field.value.type) &&
          field.value.type.VectorType().base_type == BASE_TYPE_STRUCT &&
          field.value.type.struct_def->fixed) {
        code += "    int? " + offset_name + ";\n";
        code += "    if (" + field_name + " != null) {\n";
        code +=
            "      for (var e in " + field_name + "!) { e.pack(fbBuilder); }\n";
        code += "      " + namer_.Variable(field) +
                "Offset = fbBuilder.endStructVector(" + field_name +
                "!.length);\n";
        code += "    }\n";
        continue;
      }

      code += "    final int? " + offset_name;
      if (IsVector(field.value.type)) {
        code += " = " + field_name + " == null ? null\n";
        code += "        : fbBuilder.writeList";
        switch (field.value.type.VectorType().base_type) {
          case BASE_TYPE_STRING:
            code +=
                "(" + field_name + "!.map(fbBuilder.writeString).toList());\n";
            break;
          case BASE_TYPE_STRUCT:
            if (field.value.type.struct_def->fixed) {
              code += "OfStructs(" + field_name + "!);\n";
            } else {
              code += "(" + field_name + "!.map((b) => b." +
                      (pack ? "pack" : "getOrCreateOffset") +
                      "(fbBuilder)).toList());\n";
            }
            break;
          default:
            code +=
                GenType(field.value.type.VectorType()) + "(" + field_name + "!";
            if (field.value.type.enum_def) {
              code += ".map((f) => f.value).toList()";
            }
            code += ");\n";
        }
      } else if (IsString(field.value.type)) {
        code += " = " + field_name + " == null ? null\n";
        code += "        : fbBuilder.writeString(" + field_name + "!);\n";
      } else {
        code += " = " + field_name + "?." +
                (pack ? "pack" : "getOrCreateOffset") + "(fbBuilder);\n";
      }
    }

    if (struct_def.fixed) {
      code += StructObjectBuilderBody(non_deprecated_fields, prependUnderscore,
                                      pack);
    } else {
      code += TableObjectBuilderBody(struct_def, non_deprecated_fields,
                                     prependUnderscore, pack);
    }
    return code;
  }